

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-multicast-join6.c
# Opt level: O1

int run_test_udp_multicast_join6(void)

{
  int iVar1;
  int extraout_EAX;
  ulong uVar2;
  undefined8 uVar3;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  undefined8 unaff_RBX;
  undefined7 uVar4;
  code *pcVar5;
  uv_udp_t *puVar6;
  char *pcVar7;
  short *psVar8;
  uv_udp_send_t *puVar9;
  uv_udp_send_t *puVar10;
  uv_udp_send_t *puVar11;
  int in_R8D;
  bool bVar12;
  sockaddr_in6 addr;
  undefined1 auStack_c0 [16];
  undefined1 auStack_ac [28];
  code *pcStack_90;
  undefined1 auStack_88 [64];
  code *pcStack_48;
  code *pcStack_40;
  int local_34;
  void *local_30;
  
  pcStack_40 = (code *)0x17a77e;
  iVar1 = uv_interface_addresses(&stack0xffffffffffffffd0,&local_34);
  if (iVar1 == 0) {
    if ((long)local_34 < 1) {
LAB_0017a93c:
      pcStack_40 = (code *)0x17a941;
      uv_free_interface_addresses();
    }
    else {
      psVar8 = (short *)((long)local_30 + 0x14);
      uVar2 = 1;
      do {
        uVar4 = (undefined7)((ulong)unaff_RBX >> 8);
        unaff_RBX = CONCAT71(uVar4,1);
        if (*psVar8 == 10) {
          unaff_RBX = CONCAT71(uVar4,*(int *)(psVar8 + -2) != 0);
        }
        if ((char)unaff_RBX == '\0') break;
        psVar8 = psVar8 + 0x28;
        bVar12 = uVar2 < (ulong)(long)local_34;
        uVar2 = uVar2 + 1;
      } while (bVar12);
      pcStack_40 = (code *)0x17a7cf;
      uv_free_interface_addresses(local_30);
      if ((char)unaff_RBX == '\0') {
        puVar9 = (uv_udp_send_t *)0x1898e9;
        pcVar5 = (code *)0x23a3;
        pcStack_40 = (code *)0x17a7ed;
        iVar1 = uv_ip6_addr("::",0x23a3,&stack0xffffffffffffffd0);
        if (iVar1 == 0) {
          pcStack_40 = (code *)0x17a7fa;
          puVar9 = (uv_udp_send_t *)uv_default_loop();
          puVar6 = &server;
          pcStack_40 = (code *)0x17a809;
          iVar1 = uv_udp_init();
          pcVar5 = (code *)puVar6;
          if (iVar1 != 0) goto LAB_0017a9c7;
          pcStack_40 = (code *)0x17a816;
          puVar9 = (uv_udp_send_t *)uv_default_loop();
          puVar6 = &client;
          pcStack_40 = (code *)0x17a825;
          iVar1 = uv_udp_init();
          pcVar5 = (code *)puVar6;
          if (iVar1 != 0) goto LAB_0017a9cc;
          puVar6 = &server;
          pcVar5 = (code *)&stack0xffffffffffffffd0;
          pcStack_40 = (code *)0x17a840;
          iVar1 = uv_udp_bind(&server,pcVar5,0);
          puVar9 = (uv_udp_send_t *)puVar6;
          if (iVar1 != 0) goto LAB_0017a9d1;
          puVar6 = &server;
          pcVar7 = "ff02::1";
          pcStack_40 = (code *)0x17a862;
          iVar1 = uv_udp_set_membership(&server,"ff02::1",0,1);
          if (iVar1 == 0) {
            puVar6 = &server;
            pcVar5 = alloc_cb;
            pcStack_40 = (code *)0x17a884;
            iVar1 = uv_udp_recv_start(&server,alloc_cb,cl_recv_cb);
            puVar9 = (uv_udp_send_t *)puVar6;
            if (iVar1 != 0) goto LAB_0017a9db;
            puVar9 = &req;
            pcStack_40 = (code *)0x17a898;
            iVar1 = do_send(&req);
            if (iVar1 != 0) goto LAB_0017a9e0;
            if (close_cb_called != 0) goto LAB_0017a9e5;
            if (cl_recv_cb_called != 0) goto LAB_0017a9ea;
            if (sv_send_cb_called != 0) goto LAB_0017a9ef;
            pcStack_40 = (code *)0x17a8cc;
            puVar9 = (uv_udp_send_t *)uv_default_loop();
            pcVar5 = (code *)0x0;
            pcStack_40 = (code *)0x17a8d6;
            uv_run();
            if (cl_recv_cb_called != 2) goto LAB_0017a9f4;
            if (sv_send_cb_called != 2) goto LAB_0017a9f9;
            if (close_cb_called == 2) {
              pcStack_40 = (code *)0x17a902;
              uVar3 = uv_default_loop();
              pcStack_40 = (code *)0x17a918;
              uv_walk(uVar3,close_walk_cb,0);
              pcStack_40 = (code *)0x17a922;
              uv_run(uVar3,0);
              pcStack_40 = (code *)0x17a927;
              uVar3 = uv_default_loop();
              pcStack_40 = (code *)0x17a92f;
              iVar1 = uv_loop_close(uVar3);
              if (iVar1 == 0) {
                return 0;
              }
              pcStack_40 = (code *)0x17a93c;
              run_test_udp_multicast_join6_cold_13();
              goto LAB_0017a93c;
            }
            goto LAB_0017a9fe;
          }
          pcVar5 = (code *)pcVar7;
          puVar9 = (uv_udp_send_t *)puVar6;
          if (iVar1 != -0x13) goto LAB_0017a9d6;
          pcStack_40 = (code *)0x17a956;
          unaff_RBX = uv_default_loop();
          pcStack_40 = (code *)0x17a96a;
          uv_walk(unaff_RBX,close_walk_cb,0);
          pcVar5 = (code *)0x0;
          pcStack_40 = (code *)0x17a974;
          uv_run(unaff_RBX);
          pcStack_40 = (code *)0x17a979;
          uVar3 = uv_default_loop();
          pcStack_40 = (code *)0x17a981;
          iVar1 = uv_loop_close(uVar3);
          puVar9 = _stderr;
          if (iVar1 == 0) {
            pcStack_40 = (code *)0x17a9a4;
            fprintf((FILE *)_stderr,"%s\n","No ipv6 multicast route");
            goto LAB_0017a9a4;
          }
        }
        else {
          pcStack_40 = (code *)0x17a9c7;
          run_test_udp_multicast_join6_cold_1();
LAB_0017a9c7:
          pcStack_40 = (code *)0x17a9cc;
          run_test_udp_multicast_join6_cold_2();
LAB_0017a9cc:
          pcStack_40 = (code *)0x17a9d1;
          run_test_udp_multicast_join6_cold_3();
LAB_0017a9d1:
          pcStack_40 = (code *)0x17a9d6;
          run_test_udp_multicast_join6_cold_4();
LAB_0017a9d6:
          pcStack_40 = (code *)0x17a9db;
          run_test_udp_multicast_join6_cold_15();
LAB_0017a9db:
          pcStack_40 = (code *)0x17a9e0;
          run_test_udp_multicast_join6_cold_5();
LAB_0017a9e0:
          pcStack_40 = (code *)0x17a9e5;
          run_test_udp_multicast_join6_cold_6();
LAB_0017a9e5:
          pcStack_40 = (code *)0x17a9ea;
          run_test_udp_multicast_join6_cold_7();
LAB_0017a9ea:
          pcStack_40 = (code *)0x17a9ef;
          run_test_udp_multicast_join6_cold_8();
LAB_0017a9ef:
          pcStack_40 = (code *)0x17a9f4;
          run_test_udp_multicast_join6_cold_9();
LAB_0017a9f4:
          pcStack_40 = (code *)0x17a9f9;
          run_test_udp_multicast_join6_cold_10();
LAB_0017a9f9:
          pcStack_40 = (code *)0x17a9fe;
          run_test_udp_multicast_join6_cold_11();
LAB_0017a9fe:
          pcStack_40 = (code *)0x17aa03;
          run_test_udp_multicast_join6_cold_12();
        }
        pcStack_40 = alloc_cb;
        run_test_udp_multicast_join6_cold_14();
        puVar11 = (uv_udp_send_t *)
                  CONCAT71(0x5481,puVar9 == (uv_udp_send_t *)&client ||
                                  puVar9 == (uv_udp_send_t *)&server);
        if (puVar9 == (uv_udp_send_t *)&client || puVar9 == (uv_udp_send_t *)&server) {
          if (pcVar5 < (uv_udp_t *)0x10001) {
            *extraout_RDX = alloc_cb::slab;
            extraout_RDX[1] = 0x10000;
            return extraout_EAX;
          }
        }
        else {
          pcStack_48 = (code *)0x17aa49;
          alloc_cb_cold_1();
        }
        pcStack_48 = cl_recv_cb;
        alloc_cb_cold_2();
        bVar12 = puVar9 == (uv_udp_send_t *)&server;
        puVar10 = (uv_udp_send_t *)(ulong)(puVar9 == (uv_udp_send_t *)&client || bVar12);
        if (puVar9 == (uv_udp_send_t *)&client || bVar12) {
          if (in_R8D != 0) goto LAB_0017ab4b;
          if ((long)pcVar5 < 0) goto LAB_0017ab50;
          if ((uv_udp_t *)pcVar5 != (uv_udp_t *)0x0) {
            if (puVar11 == (uv_udp_send_t *)0x0) goto LAB_0017ab55;
            if ((uv_udp_t *)pcVar5 != (uv_udp_t *)0x4) goto LAB_0017ab5a;
            if (*(int *)*extraout_RDX_00 == 0x474e4950) {
              cl_recv_cb_called = cl_recv_cb_called + 1;
              if (cl_recv_cb_called == 2) {
                iVar1 = uv_close(&server,close_cb);
                return iVar1;
              }
              goto LAB_0017aae0;
            }
            goto LAB_0017ab5f;
          }
          if (puVar11 == (uv_udp_send_t *)0x0) {
            return (int)CONCAT71(0x5480,bVar12);
          }
          pcStack_90 = (code *)0x17aae0;
          cl_recv_cb_cold_10();
LAB_0017aae0:
          pcStack_90 = (code *)0x17aaf0;
          iVar1 = uv_ip6_name(puVar11,auStack_88,0x40);
          if (iVar1 != 0) goto LAB_0017ab64;
          puVar6 = &server;
          pcStack_90 = (code *)0x17ab0b;
          iVar1 = uv_udp_set_membership(&server,"ff02::1",0,0);
          puVar11 = (uv_udp_send_t *)puVar6;
          if (iVar1 != 0) goto LAB_0017ab69;
          puVar6 = &server;
          pcStack_90 = (code *)0x17ab2d;
          iVar1 = uv_udp_set_source_membership(&server,"ff02::1",0,auStack_88,1);
          puVar11 = (uv_udp_send_t *)puVar6;
          if (iVar1 == 0) {
            puVar11 = &req_ss;
            pcStack_90 = (code *)0x17ab3d;
            iVar1 = do_send(&req_ss);
            if (iVar1 == 0) {
              return 0;
            }
            goto LAB_0017ab73;
          }
        }
        else {
          pcStack_90 = (code *)0x17ab4b;
          cl_recv_cb_cold_1();
LAB_0017ab4b:
          pcStack_90 = (code *)0x17ab50;
          cl_recv_cb_cold_2();
LAB_0017ab50:
          pcStack_90 = (code *)0x17ab55;
          cl_recv_cb_cold_11();
LAB_0017ab55:
          pcStack_90 = (code *)0x17ab5a;
          cl_recv_cb_cold_9();
LAB_0017ab5a:
          pcStack_90 = (code *)0x17ab5f;
          cl_recv_cb_cold_3();
LAB_0017ab5f:
          puVar11 = puVar10;
          pcStack_90 = (code *)0x17ab64;
          cl_recv_cb_cold_4();
LAB_0017ab64:
          pcStack_90 = (code *)0x17ab69;
          cl_recv_cb_cold_5();
LAB_0017ab69:
          pcStack_90 = (code *)0x17ab6e;
          cl_recv_cb_cold_6();
        }
        pcStack_90 = (code *)0x17ab73;
        cl_recv_cb_cold_7();
LAB_0017ab73:
        pcStack_90 = do_send;
        cl_recv_cb_cold_8();
        pcStack_90 = (code *)unaff_RBX;
        auStack_c0 = uv_buf_init("PING",4);
        pcVar7 = "ff02::1";
        iVar1 = uv_ip6_addr("ff02::1",0x23a3,auStack_ac);
        if (iVar1 == 0) {
          iVar1 = uv_udp_send(puVar11,&client,auStack_c0,1,auStack_ac,sv_send_cb);
          return iVar1;
        }
        do_send_cold_1();
        iVar1 = uv_is_closing();
        if (iVar1 == 0) {
          iVar1 = uv_close(pcVar7,0);
          return iVar1;
        }
        return iVar1;
      }
    }
  }
  pcStack_40 = (code *)0x17a946;
  run_test_udp_multicast_join6_cold_16();
LAB_0017a9a4:
  pcStack_40 = (code *)0x17a9b3;
  fflush((FILE *)_stderr);
  return 1;
}

Assistant:

TEST_IMPL(udp_multicast_join6) {
  int r;
  struct sockaddr_in6 addr;

  if (!can_ipv6_external())
    RETURN_SKIP("No external IPv6 interface available");

  ASSERT(0 == uv_ip6_addr("::", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  /* bind to the desired port */
  r = uv_udp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_udp_set_membership(&server, MULTICAST_ADDR, INTERFACE_ADDR, UV_JOIN_GROUP);
  if (r == UV_ENODEV) {
    MAKE_VALGRIND_HAPPY();
    RETURN_SKIP("No ipv6 multicast route");
  }

  ASSERT(r == 0);

  r = uv_udp_recv_start(&server, alloc_cb, cl_recv_cb);
  ASSERT(r == 0);
  
  r = do_send(&req);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 0);
  ASSERT(cl_recv_cb_called == 0);
  ASSERT(sv_send_cb_called == 0);

  /* run the loop till all events are processed */
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(cl_recv_cb_called == 2);
  ASSERT(sv_send_cb_called == 2);
  ASSERT(close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}